

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O1

bool __thiscall chatter::Protocol::handle_pong(Protocol *this,ptr *packet)

{
  PeerState PVar1;
  Packet *this_00;
  Peer *pPVar2;
  long in_RAX;
  uint64_t uVar3;
  long lVar4;
  size_t in_RCX;
  void *in_RDX;
  float fVar5;
  float fVar6;
  uint64_t ts;
  long local_28;
  
  this_00 = (packet->super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pPVar2 = this_00->m_peer;
  PVar1 = pPVar2->m_state;
  if (PVar1 == CONNECTED) {
    local_28 = in_RAX;
    Packet::read(this_00,(int)&local_28,in_RDX,in_RCX);
    uVar3 = Host::timestamp_now(this->m_host);
    fVar5 = (float)(uVar3 - ((ulong)pPVar2->m_rtt_avg + local_28));
    fVar6 = fVar5 * 0.125;
    lVar4 = (long)fVar6;
    pPVar2->m_rtt_avg =
         ((ushort)lVar4 | (ushort)(long)(fVar6 - 9.223372e+18) & (ushort)(lVar4 >> 0x3f)) +
         pPVar2->m_rtt_avg;
    fVar5 = (fVar5 - (float)pPVar2->m_rtt_dev) * 0.25;
    lVar4 = (long)fVar5;
    pPVar2->m_rtt_dev =
         ((ushort)lVar4 | (ushort)(long)(fVar5 - 9.223372e+18) & (ushort)(lVar4 >> 0x3f)) +
         pPVar2->m_rtt_dev;
    uVar3 = Host::timestamp_now(this->m_host);
    pPVar2->m_last_rtt_ts = uVar3;
  }
  return PVar1 == CONNECTED;
}

Assistant:

bool Protocol::handle_pong(const Packet::ptr packet)
{
    Peer* peer = packet->m_peer;
    if (peer->m_state != PeerState::CONNECTED)
        /* TODO(ben): Peer not connected error */
        return false;

    uint64_t ts;
    packet->read(ts);

    calculate_rtt(peer, m_host->timestamp_now() - ts);

    return true;
}